

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

void lj_meta_call(lua_State *L,TValue *func,TValue *top)

{
  cTValue *pcVar1;
  TValue *in_RDX;
  cTValue *in_RSI;
  undefined8 in_RDI;
  TValue *p;
  cTValue *mo;
  cTValue *local_58;
  cTValue *in_stack_ffffffffffffffd0;
  lua_State *in_stack_ffffffffffffffd8;
  
  local_58 = in_RDX;
  pcVar1 = lj_meta_lookup(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                          (MMS)((ulong)in_RDI >> 0x20));
  if ((pcVar1->field_2).it == 0xfffffff7) {
    for (; in_RSI < local_58; local_58 = local_58 + -1) {
      *local_58 = local_58[-1];
    }
    *in_RSI = *pcVar1;
    return;
  }
  lj_err_optype_call((lua_State *)&in_RSI->field_2,local_58);
}

Assistant:

void lj_meta_call(lua_State *L, TValue *func, TValue *top)
{
  cTValue *mo = lj_meta_lookup(L, func, MM_call);
  TValue *p;
  if (!tvisfunc(mo))
    lj_err_optype_call(L, func);
  for (p = top; p > func; p--) copyTV(L, p, p-1);
  copyTV(L, func, mo);
}